

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfuturewatcher.cpp
# Opt level: O3

void QFutureWatcherBase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  QFutureInterfaceBase *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined1 suspend;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_10;
  undefined4 extraout_var;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == started && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == finished && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == canceled && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == paused && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == suspending && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == suspended && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar1 == resumed && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar1 == resultReadyAt && lVar2 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar1 == resultsReadyAt && lVar2 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar1 == progressRangeChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (pcVar1 == progressValueChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (pcVar1 == progressTextChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    goto switchD_003d0e31_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_003d0e31_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 0;
LAB_003d110f:
      QMetaObject::activate(_o,&staticMetaObject,iVar3,(void **)0x0);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 1;
      goto LAB_003d110f;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 2;
      goto LAB_003d110f;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 3;
      goto LAB_003d110f;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 4;
      goto LAB_003d110f;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 5;
      goto LAB_003d110f;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar3 = 6;
      goto LAB_003d110f;
    }
    break;
  case 7:
    local_2c = *_a[1];
    local_20 = &local_2c;
    iVar3 = 7;
    goto LAB_003d1144;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      resultsReadyAt((QFutureWatcherBase *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      progressRangeChanged((QFutureWatcherBase *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 10:
    local_2c = *_a[1];
    local_20 = &local_2c;
    iVar3 = 10;
    goto LAB_003d1144;
  case 0xb:
    local_20 = (undefined4 *)_a[1];
    iVar3 = 0xb;
LAB_003d1144:
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
switchD_003d0e31_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 0xc:
    iVar3 = (*_o->_vptr_QObject[0xd])();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QFutureInterfaceBase::cancel((QFutureInterfaceBase *)CONCAT44(extraout_var_02,iVar3));
      return;
    }
    break;
  case 0xd:
  case 0x11:
    suspend = *_a[1];
    iVar3 = (*_o->_vptr_QObject[0xd])();
    this = (QFutureInterfaceBase *)CONCAT44(extraout_var,iVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_003d10e5:
      QFutureInterfaceBase::setSuspended(this,(bool)suspend);
      return;
    }
    break;
  case 0xe:
  case 0x12:
    iVar3 = (*_o->_vptr_QObject[0xd])();
    this = (QFutureInterfaceBase *)CONCAT44(extraout_var_01,iVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      suspend = true;
      goto LAB_003d10e5;
    }
    break;
  case 0xf:
    iVar3 = (*_o->_vptr_QObject[0xd])();
    this = (QFutureInterfaceBase *)CONCAT44(extraout_var_03,iVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      suspend = false;
      goto LAB_003d10e5;
    }
    break;
  case 0x10:
  case 0x13:
    iVar3 = (*_o->_vptr_QObject[0xd])();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QFutureInterfaceBase::toggleSuspended((QFutureInterfaceBase *)CONCAT44(extraout_var_00,iVar3))
      ;
      return;
    }
    break;
  default:
    goto switchD_003d0e31_default;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureWatcherBase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFutureWatcherBase *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(); break;
        case 1: _t->finished(); break;
        case 2: _t->canceled(); break;
        case 3: _t->paused(); break;
        case 4: _t->suspending(); break;
        case 5: _t->suspended(); break;
        case 6: _t->resumed(); break;
        case 7: _t->resultReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->resultsReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->progressRangeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->progressValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->progressTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->cancel(); break;
        case 13: _t->setSuspended((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->suspend(); break;
        case 15: _t->resume(); break;
        case 16: _t->toggleSuspended(); break;
        case 17: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 18: _t->pause(); break;
        case 19: _t->togglePaused(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::canceled, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::paused, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspending, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspended, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::resumed, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::resultReadyAt, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::resultsReadyAt, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::progressRangeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::progressValueChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(const QString & )>(_a, &QFutureWatcherBase::progressTextChanged, 11))
            return;
    }
}